

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_pack8to1_int8.h
# Opt level: O0

void ncnn::convolution_pack8to1_int8_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *weight_data_int8,int kernel_w,int kernel_h,
               int dilation_w,int dilation_h,int stride_w,int stride_h,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int in_ECX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int s4 [4];
  __m128i _s4;
  __m128i _s1;
  __m128i _s0;
  __m128i _sh;
  __m128i _sl;
  __m128i _w;
  __m128i _val;
  int k;
  char *sptr;
  Mat m_2;
  int q;
  char *kptr;
  int sum;
  int j_1;
  int i_1;
  int *outptr;
  int p;
  int j;
  int i;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int outch;
  int outh;
  int outw;
  int channels;
  int w;
  Mat *m;
  Mat *m_3;
  Mat *m_1;
  allocator_type *in_stack_fffffffffffff9e0;
  size_type in_stack_fffffffffffff9e8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff9f0;
  int local_5b8;
  int iStack_5b4;
  int iStack_5b0;
  int iStack_5ac;
  undefined1 local_5a8 [16];
  undefined1 local_598 [16];
  undefined1 local_588 [16];
  undefined1 local_578 [16];
  undefined1 local_568 [16];
  undefined1 local_558 [16];
  undefined1 local_548 [16];
  int local_52c;
  long local_528;
  undefined8 local_520;
  undefined8 local_518;
  undefined8 local_510;
  undefined4 local_508;
  long local_500;
  undefined4 local_4f8;
  undefined4 local_4f4;
  undefined4 local_4f0;
  undefined4 local_4ec;
  undefined4 local_4e8;
  undefined8 local_4e0;
  int local_4d4;
  undefined8 local_4d0;
  undefined8 local_4c8;
  undefined8 local_4c0;
  undefined4 local_4b8;
  long local_4b0;
  undefined4 local_4a8;
  undefined4 local_4a4;
  undefined4 local_4a0;
  undefined4 local_49c;
  undefined4 local_498;
  undefined8 local_490;
  ulong *local_488;
  int local_47c;
  int local_478;
  int local_474;
  undefined8 local_470;
  undefined8 local_468;
  undefined8 local_460;
  undefined4 local_458;
  long local_450;
  undefined4 local_448;
  undefined4 local_444;
  undefined4 local_440;
  undefined4 local_43c;
  undefined4 local_438;
  undefined8 local_430;
  long local_428;
  int local_420;
  int local_41c;
  int local_418;
  int local_414;
  int local_410;
  int local_40c;
  reference local_408;
  vector<int,_std::allocator<int>_> local_3e8;
  int local_3cc;
  int local_3c8;
  int local_3c4;
  int local_3c0;
  int local_3bc;
  int local_3b8;
  int local_3b4;
  int local_3b0;
  int local_3ac;
  long *local_3a8;
  long *local_3a0;
  long *local_398;
  undefined8 *local_390;
  undefined8 *local_388;
  undefined8 *local_380;
  undefined8 *local_370;
  undefined8 *local_360;
  undefined8 *local_350;
  undefined1 local_345;
  int local_344;
  undefined8 *local_338;
  undefined1 local_315;
  int local_314;
  long *local_310;
  undefined8 *local_308;
  undefined1 local_2e5;
  int local_2e4;
  undefined8 *local_2d8;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  long local_268;
  undefined4 local_25c;
  long local_258;
  ulong *local_250;
  undefined4 local_244;
  int local_240;
  int local_23c;
  undefined8 *local_238;
  long local_230;
  undefined4 local_224;
  long local_220;
  long local_218;
  undefined4 local_20c;
  int local_208;
  int local_204;
  allocator_type *local_200;
  long local_1f8;
  undefined4 local_1ec;
  long local_1e8;
  long local_1e0;
  undefined4 local_1d4;
  int local_1d0;
  int local_1cc;
  undefined8 *local_1c8;
  undefined4 local_1bc;
  long local_1b8;
  undefined4 local_1ac;
  long local_1a8;
  undefined4 local_19c;
  long local_198;
  undefined8 *local_190;
  undefined8 local_188;
  undefined8 uStack_180;
  int *local_178;
  undefined8 *local_170;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  ulong local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  ulong uStack_130;
  ulong local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  ulong uStack_110;
  undefined1 local_108 [16];
  ulong local_f8;
  undefined8 uStack_f0;
  undefined1 local_e8 [16];
  ulong local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  ulong local_48;
  undefined8 uStack_40;
  ulong *local_30;
  ulong local_28;
  undefined8 uStack_20;
  ulong *local_18;
  int local_c;
  undefined8 *local_8;
  
  local_3b8 = *(int *)((long)in_RDI + 0x2c);
  local_3bc = (int)in_RDI[7];
  local_3c0 = *(int *)((long)in_RSI + 0x2c);
  local_3c4 = (int)in_RSI[6];
  local_3c8 = (int)in_RSI[7];
  local_3cc = in_ECX * in_R8D;
  local_3b4 = in_R9D;
  local_3b0 = in_R8D;
  local_3ac = in_ECX;
  local_3a8 = in_RDX;
  local_3a0 = in_RSI;
  local_398 = in_RDI;
  std::allocator<int>::allocator((allocator<int> *)0x897bd4);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
  std::allocator<int>::~allocator((allocator<int> *)0x897bfa);
  local_408 = std::vector<int,_std::allocator<int>_>::operator[](&local_3e8,0);
  local_40c = 0;
  local_410 = 0;
  local_414 = local_3b8 * in_stack_00000008 - local_3ac * local_3b4;
  for (local_418 = 0; local_418 < local_3b0; local_418 = local_418 + 1) {
    for (local_41c = 0; local_41c < local_3ac; local_41c = local_41c + 1) {
      local_408[local_40c] = local_410;
      local_40c = local_40c + 1;
      local_410 = local_3b4 + local_410;
    }
    local_410 = local_414 + local_410;
  }
  for (local_420 = 0; local_420 < local_3c8; local_420 = local_420 + 1) {
    local_338 = &local_470;
    local_1cc = *(int *)((long)local_3a0 + 0x2c);
    local_1d0 = (int)local_3a0[6];
    local_1d4 = *(undefined4 *)((long)local_3a0 + 0x34);
    local_1e0 = *local_3a0 + local_3a0[8] * (long)local_420 * local_3a0[2];
    local_1e8 = local_3a0[2];
    local_1ec = (undefined4)local_3a0[3];
    local_1f8 = local_3a0[4];
    local_1c8 = &local_470;
    local_1b8 = (long)local_1cc * (long)local_1d0 * local_1e8;
    local_170 = &local_470;
    local_390 = &local_470;
    local_1bc = 0x10;
    local_344 = local_420;
    local_345 = 1;
    local_470 = 0;
    local_460 = 0;
    local_458 = 0;
    local_448 = 0;
    local_444 = 0;
    local_440 = 0;
    local_43c = 0;
    local_438 = 0;
    local_430 = 0;
    local_468 = 0;
    local_428 = local_1e0;
    for (local_474 = 0; local_474 < local_3c4; local_474 = local_474 + 1) {
      for (local_478 = 0; local_478 < local_3c0; local_478 = local_478 + 1) {
        local_2d8 = &local_4d0;
        local_23c = *(int *)((long)local_3a8 + 0x2c);
        local_240 = (int)local_3a8[6];
        local_244 = *(undefined4 *)((long)local_3a8 + 0x34);
        local_250 = (ulong *)(*local_3a8 + local_3a8[8] * (long)local_420 * local_3a8[2]);
        local_258 = local_3a8[2];
        local_25c = (undefined4)local_3a8[3];
        local_268 = local_3a8[4];
        local_238 = &local_4d0;
        local_198 = (long)local_23c * (long)local_240 * local_258;
        local_190 = &local_4d0;
        local_388 = &local_4d0;
        local_19c = 0x10;
        local_2e4 = local_420;
        local_2e5 = 1;
        local_47c = 0;
        local_4d0 = 0;
        local_4c0 = 0;
        local_4b8 = 0;
        local_4a8 = 0;
        local_4a4 = 0;
        local_4a0 = 0;
        local_49c = 0;
        local_498 = 0;
        local_490 = 0;
        local_4c8 = 0;
        local_488 = local_250;
        for (local_4d4 = 0; local_4d4 < local_3bc; local_4d4 = local_4d4 + 1) {
          local_308 = &local_520;
          local_310 = local_398;
          local_314 = local_4d4;
          local_204 = *(int *)((long)local_398 + 0x2c);
          local_208 = (int)local_398[6];
          local_20c = *(undefined4 *)((long)local_398 + 0x34);
          local_218 = *local_398 + local_398[8] * (long)local_4d4 * local_398[2];
          local_220 = local_398[2];
          local_224 = (undefined4)local_398[3];
          local_230 = local_398[4];
          in_stack_fffffffffffff9e0 = (allocator_type *)&local_520;
          local_1a8 = (long)local_204 * (long)local_208 * local_220;
          local_1ac = 0x10;
          local_315 = 1;
          local_c = local_474 * in_stack_00000018;
          local_8 = &local_520;
          local_528 = local_218 + (long)local_204 * (long)local_c * local_220 +
                      (long)(local_478 * in_stack_00000010 * 8);
          for (local_52c = 0; local_52c < local_3cc; local_52c = local_52c + 1) {
            local_18 = (ulong *)(local_528 + (local_408[local_52c] << 3));
            local_128 = *local_18;
            uStack_20 = 0;
            local_168 = ZEXT816(0) << 0x20;
            local_158._8_8_ = SUB168(ZEXT816(0),4);
            local_118 = 0;
            uStack_110 = local_158._8_8_;
            uStack_120 = 0;
            auVar5._8_8_ = 0;
            auVar5._0_8_ = local_158._8_8_;
            auVar2._8_8_ = 0;
            auVar2._0_8_ = local_128;
            local_e8 = vpcmpgtb_avx(auVar5 << 0x40,auVar2);
            uStack_d0 = 0;
            auVar4._8_8_ = 0;
            auVar4._0_8_ = local_128;
            local_548 = vpunpcklbw_avx(auVar4,local_e8);
            local_30 = local_488;
            local_148 = *local_488;
            uStack_40 = 0;
            local_138 = 0;
            uStack_130 = local_158._8_8_;
            uStack_140 = 0;
            auVar6._8_8_ = 0;
            auVar6._0_8_ = local_158._8_8_;
            auVar1._8_8_ = 0;
            auVar1._0_8_ = local_148;
            local_108 = vpcmpgtb_avx(auVar6 << 0x40,auVar1);
            uStack_f0 = 0;
            auVar3._8_8_ = 0;
            auVar3._0_8_ = local_148;
            local_558 = vpunpcklbw_avx(auVar3,local_108);
            local_b8 = local_548._0_8_;
            uStack_b0 = local_548._8_8_;
            local_c8 = local_558._0_8_;
            uStack_c0 = local_558._8_8_;
            local_568 = vpmullw_avx(local_548,local_558);
            local_98 = local_548._0_8_;
            uStack_90 = local_548._8_8_;
            local_a8 = local_558._0_8_;
            uStack_a0 = local_558._8_8_;
            local_578 = vpmulhw_avx(local_548,local_558);
            local_78 = local_568._0_8_;
            uStack_70 = local_568._8_8_;
            local_88 = local_578._0_8_;
            uStack_80 = local_578._8_8_;
            local_588 = vpunpcklwd_avx(local_568,local_578);
            local_58 = local_568._0_8_;
            uStack_50 = local_568._8_8_;
            local_68 = local_578._0_8_;
            uStack_60 = local_578._8_8_;
            local_598 = vpunpckhwd_avx(local_568,local_578);
            local_278 = local_588._0_8_;
            uStack_270 = local_588._8_8_;
            local_288 = local_598._0_8_;
            uStack_280 = local_598._8_8_;
            local_5a8 = vpaddd_avx(local_588,local_598);
            local_178 = &local_5b8;
            local_188 = local_5a8._0_8_;
            uStack_180 = local_5a8._8_8_;
            iStack_5b4 = local_5a8._4_4_;
            local_5b8 = local_5a8._0_4_;
            iStack_5ac = local_5a8._12_4_;
            iStack_5b0 = local_5a8._8_4_;
            local_47c = local_5b8 + iStack_5b4 + iStack_5b0 + iStack_5ac + local_47c;
            local_488 = local_488 + 1;
            local_158 = local_168;
            local_f8 = local_148;
            local_d8 = local_128;
            local_48 = local_148;
            local_28 = local_128;
          }
          local_380 = &local_520;
          local_520 = 0;
          local_510 = 0;
          local_508 = 0;
          local_4f8 = 0;
          local_4f4 = 0;
          local_4f0 = 0;
          local_4ec = 0;
          local_4e8 = 0;
          local_4e0 = 0;
          local_518 = 0;
          local_370 = local_380;
          local_200 = in_stack_fffffffffffff9e0;
          local_500 = local_230;
        }
        *(int *)(local_428 + (long)local_478 * 4) = local_47c;
        local_360 = local_388;
        local_4b0 = local_268;
      }
      local_428 = local_428 + (long)local_3c0 * 4;
    }
    local_350 = local_390;
    local_450 = local_1f8;
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9e0);
  return;
}

Assistant:

static void convolution_pack8to1_int8_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data_int8, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, const Option& opt)
{
    int w = bottom_blob.w;
    int channels = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        int* outptr = top_blob.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                int sum = 0;

                const signed char* kptr = weight_data_int8.channel(p);

                // channels
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);
                    const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w * 8;

                    for (int k = 0; k < maxk; k++)
                    {
                        // TODO use _mm_cvtepi8_epi16 on sse4.1
                        __m128i _val = _mm_loadl_epi64((const __m128i*)(sptr + space_ofs[k] * 8));
                        _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));

                        __m128i _w = _mm_loadl_epi64((const __m128i*)kptr);
                        _w = _mm_unpacklo_epi8(_w, _mm_cmpgt_epi8(_mm_setzero_si128(), _w));

                        __m128i _sl = _mm_mullo_epi16(_val, _w);
                        __m128i _sh = _mm_mulhi_epi16(_val, _w);
                        __m128i _s0 = _mm_unpacklo_epi16(_sl, _sh);
                        __m128i _s1 = _mm_unpackhi_epi16(_sl, _sh);

                        __m128i _s4 = _mm_add_epi32(_s0, _s1);

                        // TODO use _mm_hadd_epi32 on ssse3
                        int s4[4];
                        _mm_storeu_si128((__m128i*)s4, _s4);
                        sum += s4[0] + s4[1] + s4[2] + s4[3]; // dot

                        kptr += 8;
                    }
                }

                outptr[j] = sum;
            }

            outptr += outw;
        }
    }
}